

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall r_code::LObject::set_reference(LObject *this,uint16_t i,Code *object)

{
  P<r_code::Code> *this_00;
  undefined6 in_register_00000032;
  
  this_00 = vector<core::P<r_code::Code>_>::operator[]
                      (&this->_references,CONCAT62(in_register_00000032,i) & 0xffffffff);
  core::P<r_code::Code>::operator=(this_00,object);
  return;
}

Assistant:

void set_reference(uint16_t i, Code *object)
    {
        _references[i] = object;
    }